

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

int goodform::json::convert_hex_to_dec(char input)

{
  undefined4 local_10;
  int iReturnValue;
  char input_local;
  
  local_10 = -1;
  if (input == '0') {
    local_10 = 0;
  }
  else if (input == '1') {
    local_10 = 1;
  }
  else if (input == '2') {
    local_10 = 2;
  }
  else if (input == '3') {
    local_10 = 3;
  }
  else if (input == '4') {
    local_10 = 4;
  }
  else if (input == '5') {
    local_10 = 5;
  }
  else if (input == '6') {
    local_10 = 6;
  }
  else if (input == '7') {
    local_10 = 7;
  }
  else if (input == '8') {
    local_10 = 8;
  }
  else if (input == '9') {
    local_10 = 9;
  }
  else if ((input == 'a') || (input == 'A')) {
    local_10 = 10;
  }
  else if ((input == 'b') || (input == 'B')) {
    local_10 = 0xb;
  }
  else if ((input == 'c') || (input == 'C')) {
    local_10 = 0xc;
  }
  else if ((input == 'd') || (input == 'D')) {
    local_10 = 0xd;
  }
  else if ((input == 'e') || (input == 'E')) {
    local_10 = 0xe;
  }
  else if ((input == 'f') || (input == 'F')) {
    local_10 = 0xf;
  }
  return local_10;
}

Assistant:

int json::convert_hex_to_dec(char input)
  {
    int iReturnValue = -1;
    if(input == '0')
      iReturnValue = 0;
    else if(input == '1')
      iReturnValue = 1;
    else if(input == '2')
      iReturnValue = 2;
    else if(input == '3')
      iReturnValue = 3;
    else if(input == '4')
      iReturnValue = 4;
    else if(input == '5')
      iReturnValue = 5;
    else if(input == '6')
      iReturnValue = 6;
    else if(input == '7')
      iReturnValue = 7;
    else if(input == '8')
      iReturnValue = 8;
    else if(input == '9')
      iReturnValue = 9;
    else if(input == 'a' || input == 'A')
      iReturnValue = 10;
    else if(input == 'b' || input == 'B')
      iReturnValue = 11;
    else if(input == 'c' || input == 'C')
      iReturnValue = 12;
    else if(input == 'd' || input == 'D')
      iReturnValue = 13;
    else if(input == 'e' || input == 'E')
      iReturnValue = 14;
    else if(input == 'f' || input == 'F')
      iReturnValue = 15;
    return iReturnValue;
  }